

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem.c
# Opt level: O1

int pem_des_decrypt(uchar *des_iv,uchar *buf,size_t buflen,uchar *pwd,size_t pwdlen)

{
  int iVar1;
  long lVar2;
  uchar des_key [8];
  mbedtls_des_context des_ctx;
  uchar local_b8 [8];
  mbedtls_des_context local_b0;
  
  mbedtls_des_init(&local_b0);
  iVar1 = pem_pbkdf1(local_b8,8,des_iv,pwd,pwdlen);
  if (iVar1 == 0) {
    iVar1 = mbedtls_des_setkey_dec(&local_b0,local_b8);
    if (iVar1 == 0) {
      iVar1 = mbedtls_des_crypt_cbc(&local_b0,0,buflen,des_iv,buf,buf);
    }
  }
  mbedtls_des_free(&local_b0);
  lVar2 = 0;
  do {
    local_b8[lVar2] = '\0';
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  return iVar1;
}

Assistant:

static int pem_des_decrypt( unsigned char des_iv[8],
                            unsigned char *buf, size_t buflen,
                            const unsigned char *pwd, size_t pwdlen )
{
    mbedtls_des_context des_ctx;
    unsigned char des_key[8];
    int ret;

    mbedtls_des_init( &des_ctx );

    if( ( ret = pem_pbkdf1( des_key, 8, des_iv, pwd, pwdlen ) ) != 0 )
        goto exit;

    if( ( ret = mbedtls_des_setkey_dec( &des_ctx, des_key ) ) != 0 )
        goto exit;
    ret = mbedtls_des_crypt_cbc( &des_ctx, MBEDTLS_DES_DECRYPT, buflen,
                     des_iv, buf, buf );

exit:
    mbedtls_des_free( &des_ctx );
    mbedtls_zeroize( des_key, 8 );

    return( ret );
}